

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.cpp
# Opt level: O2

void __thiscall
OptionParser::parseReactOption
          (OptionParser *this,Network *network,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  ValueOption option;
  bool bVar1;
  InputError *pIVar2;
  string *psVar3;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  double local_50;
  double value;
  allocator local_21;
  
  psVar3 = (tokenList->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(tokenList->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar3) < 0x41) {
    pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_f0,"",(allocator *)&value);
    InputError::InputError(pIVar2,2,&local_f0);
    __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
  }
  bVar1 = Utilities::parseNumber<double>(psVar3 + 2,&local_50);
  if (bVar1) {
    std::__cxx11::string::string((string *)&value,"ORDER",&local_21);
    bVar1 = Utilities::match(psVar3,(string *)&value);
    std::__cxx11::string::~string((string *)&value);
    if (bVar1) {
      std::__cxx11::string::string((string *)&value,"BULK",&local_21);
      psVar3 = psVar3 + 1;
      bVar1 = Utilities::match(psVar3,(string *)&value);
      std::__cxx11::string::~string((string *)&value);
      if (bVar1) {
        option = BULK_ORDER;
      }
      else {
        std::__cxx11::string::string((string *)&value,"WALL",&local_21);
        bVar1 = Utilities::match(psVar3,(string *)&value);
        std::__cxx11::string::~string((string *)&value);
        if (bVar1) {
          option = WALL_ORDER;
        }
        else {
          std::__cxx11::string::string((string *)&value,"TANK",&local_21);
          bVar1 = Utilities::match(psVar3,(string *)&value);
          std::__cxx11::string::~string((string *)&value);
          if (!bVar1) {
            pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string((string *)&local_b0,(string *)psVar3);
            InputError::InputError(pIVar2,3,&local_b0);
            __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
          }
          option = TANK_ORDER;
        }
      }
    }
    else {
      std::__cxx11::string::string((string *)&value,"GLOBAL",&local_21);
      bVar1 = Utilities::match(psVar3,(string *)&value);
      std::__cxx11::string::~string((string *)&value);
      if (bVar1) {
        std::__cxx11::string::string((string *)&value,"BULK",&local_21);
        psVar3 = psVar3 + 1;
        bVar1 = Utilities::match(psVar3,(string *)&value);
        std::__cxx11::string::~string((string *)&value);
        if (bVar1) {
          option = BULK_COEFF;
        }
        else {
          std::__cxx11::string::string((string *)&value,"WALL",&local_21);
          bVar1 = Utilities::match(psVar3,(string *)&value);
          std::__cxx11::string::~string((string *)&value);
          if (!bVar1) {
            pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string((string *)&local_90,(string *)psVar3);
            InputError::InputError(pIVar2,3,&local_90);
            __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
          }
          option = WALL_COEFF;
        }
      }
      else {
        std::__cxx11::string::string((string *)&value,"LIMITING",&local_21);
        bVar1 = Utilities::match(psVar3,(string *)&value);
        std::__cxx11::string::~string((string *)&value);
        if (bVar1) {
          option = LIMITING_CONCEN;
        }
        else {
          std::__cxx11::string::string((string *)&value,"ROUGHNESS",&local_21);
          bVar1 = Utilities::match(psVar3,(string *)&value);
          std::__cxx11::string::~string((string *)&value);
          if (!bVar1) {
            pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
            std::__cxx11::string::string((string *)&local_70,(string *)psVar3);
            InputError::InputError(pIVar2,3,&local_70);
            __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
          }
          option = ROUGHNESS_FACTOR;
        }
      }
    }
    Options::setOption(&network->options,option,local_50);
    return;
  }
  pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_d0,(string *)(psVar3 + 2));
  InputError::InputError(pIVar2,6,&local_d0);
  __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
}

Assistant:

void OptionParser::parseReactOption(Network* network, vector<string>& tokenList)
{
    // ... check for enough tokens

    if ( tokenList.size() < 3 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    // ... read reaction value (3rd token)

    double value;
    if ( !Utilities::parseNumber(tokens[2], value) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[2]);
    }

    // ... reaction order options

    if (Utilities::match(tokens[0], w_ORDER))
    {
        if (Utilities::match(tokens[1], w_BULK))
        {
            network->options.setOption(Options::BULK_ORDER, value);
        }
        else if (Utilities::match(tokens[1], w_WALL))
        {
            network->options.setOption(Options::WALL_ORDER, value);
        }
        else if (Utilities::match(tokens[1], w_TANK))
        {
            network->options.setOption(Options::TANK_ORDER, value);
        }
        else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);
    }

    // ... global reaction rate coeffs.

    else if (Utilities::match(tokens[0], w_GLOBAL))
    {
        if (Utilities::match(tokens[1], w_BULK))
        {
            network->options.setOption(Options::BULK_COEFF, value);
        }
        else if (Utilities::match(tokens[1], w_WALL))
        {
            network->options.setOption(Options::WALL_COEFF, value);
        }
        else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);
    }

    // ... limiting concentration option

    else if (Utilities::match(tokens[0], w_LIMITING))
    {
        network->options.setOption(Options::LIMITING_CONCEN, value);
    }

    // ... wall demand roughness correlation option

    else if (Utilities::match(tokens[0], w_ROUGHNESS))
    {
        network->options.setOption(Options::ROUGHNESS_FACTOR, value);
    }

    else throw InputError(InputError::INVALID_KEYWORD, tokens[0]);
}